

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createQuadMosaic
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,int rows,int columns)

{
  int iVar1;
  int columnNdx;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 local_b0 [24];
  float local_98;
  float local_94;
  value_type local_90;
  value_type local_70;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar4 = (float)rows;
  fVar6 = (float)columns;
  iVar1 = 0;
  if (columns < 1) {
    columns = 0;
  }
  if (rows < 1) {
    rows = 0;
  }
  iVar3 = 0;
  for (; iVar1 != rows; iVar1 = iVar1 + 1) {
    fVar7 = (float)iVar1 * (2.0 / fVar4) + -1.0;
    fVar5 = 2.0 / fVar4 + fVar7;
    for (iVar2 = 0; columns != iVar2; iVar2 = iVar2 + 1) {
      local_70.position.m_data[0] = (float)iVar2 * (2.0 / fVar6) + -1.0;
      local_98 = (float)(iVar3 + iVar2);
      local_50.position.m_data[2] = 0.0;
      local_50.position.m_data[3] = 1.0;
      local_50.texCoord.m_data[0] = 0.0;
      local_50.texCoord.m_data[1] = 0.0;
      local_50.texCoord.m_data[3] = 0.0;
      local_70.position.m_data[2] = 0.0;
      local_70.position.m_data[3] = 1.0;
      local_70.texCoord.m_data[0] = 0.0;
      local_70.texCoord.m_data[1] = 1.0;
      local_70.texCoord.m_data[3] = 0.0;
      local_b0._0_4_ = local_70.position.m_data[0] + 2.0 / fVar6;
      local_90.position.m_data[2] = 0.0;
      local_90.position.m_data[3] = 1.0;
      local_90.texCoord.m_data[0] = 1.0;
      local_90.texCoord.m_data[1] = 0.0;
      local_90.texCoord.m_data[3] = 0.0;
      local_b0._8_4_ = 0.0;
      local_b0._12_4_ = 1.0;
      local_b0._16_8_ = &DAT_3f8000003f800000;
      local_94 = 0.0;
      local_b0._4_4_ = fVar5;
      local_90.position.m_data[0] = (float)local_b0._0_4_;
      local_90.position.m_data[1] = fVar7;
      local_90.texCoord.m_data[2] = local_98;
      local_70.position.m_data[1] = fVar5;
      local_70.texCoord.m_data[2] = local_98;
      local_50.position.m_data[0] = local_70.position.m_data[0];
      local_50.position.m_data[1] = fVar7;
      local_50.texCoord.m_data[2] = local_98;
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,&local_50);
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,&local_90);
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,&local_70);
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,&local_70);
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,&local_90);
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,(value_type *)local_b0);
    }
    iVar3 = iVar3 + iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createQuadMosaic (int rows, int columns)
{
	using tcu::Vec4;

	DE_ASSERT(rows >= 1);
	DE_ASSERT(columns >= 1);

	std::vector<Vertex4Tex4>	vertices;
	const float					rowSize		= 2.0f / (float)rows;
	const float					columnSize	= 2.0f / (float)columns;
	int							arrayIndex	= 0;

	for (int rowNdx = 0; rowNdx < rows; rowNdx++)
	{
		for (int columnNdx = 0; columnNdx < columns; columnNdx++)
		{
			const Vertex4Tex4 lowerLeftVertex =
			{
				Vec4(-1.0f + (float)columnNdx * columnSize, -1.0f + (float)rowNdx * rowSize, 0.0f, 1.0f),
				Vec4(0.0f, 0.0f, (float)arrayIndex, 0.0f)
			};
			const Vertex4Tex4 upperLeftVertex =
			{
				Vec4(lowerLeftVertex.position.x(), lowerLeftVertex.position.y() + rowSize, 0.0f, 1.0f),
				Vec4(0.0f, 1.0f, (float)arrayIndex, 0.0f)
			};
			const Vertex4Tex4 lowerRightVertex =
			{
				Vec4(lowerLeftVertex.position.x() + columnSize, lowerLeftVertex.position.y(), 0.0f, 1.0f),
				Vec4(1.0f, 0.0f, (float)arrayIndex, 0.0f)
			};
			const Vertex4Tex4 upperRightVertex =
			{
				Vec4(lowerLeftVertex.position.x() + columnSize, lowerLeftVertex.position.y() + rowSize, 0.0f, 1.0f),
				Vec4(1.0f, 1.0f, (float)arrayIndex, 0.0f)
			};

			vertices.push_back(lowerLeftVertex);
			vertices.push_back(lowerRightVertex);
			vertices.push_back(upperLeftVertex);
			vertices.push_back(upperLeftVertex);
			vertices.push_back(lowerRightVertex);
			vertices.push_back(upperRightVertex);

			arrayIndex++;
		}
	}

	return vertices;
}